

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::FindManufacturer
          (SystemInformationImplementation *this,string *family)

{
  string *__lhs;
  bool bVar1;
  int iVar2;
  Manufacturer MVar3;
  
  __lhs = &(this->ChipID).Vendor;
  bVar1 = std::operator==(__lhs,"GenuineIntel");
  if (bVar1) {
    MVar3 = Intel;
  }
  else {
    bVar1 = std::operator==(__lhs,"UMC UMC UMC ");
    if (bVar1) {
      MVar3 = UMC;
    }
    else {
      bVar1 = std::operator==(__lhs,"AuthenticAMD");
      MVar3 = AMD;
      if ((!bVar1) && (bVar1 = std::operator==(__lhs,"AMD ISBETTER"), !bVar1)) {
        bVar1 = std::operator==(__lhs,"HygonGenuine");
        if (bVar1) {
          MVar3 = Hygon;
        }
        else {
          bVar1 = std::operator==(__lhs,"CyrixInstead");
          if (bVar1) {
            MVar3 = Cyrix;
          }
          else {
            bVar1 = std::operator==(__lhs,"NexGenDriven");
            if (bVar1) {
              MVar3 = NexGen;
            }
            else {
              bVar1 = std::operator==(__lhs,"CentaurHauls");
              if (bVar1) {
                MVar3 = IDT;
              }
              else {
                bVar1 = std::operator==(__lhs,"  Shanghai  ");
                if (bVar1) {
                  MVar3 = Zhaoxin;
                }
                else {
                  bVar1 = std::operator==(__lhs,"RiseRiseRise");
                  if (bVar1) {
                    MVar3 = Rise;
                  }
                  else {
                    bVar1 = std::operator==(__lhs,"GenuineTMx86");
                    MVar3 = Transmeta;
                    if ((!bVar1) && (bVar1 = std::operator==(__lhs,"TransmetaCPU"), !bVar1)) {
                      bVar1 = std::operator==(__lhs,"Geode By NSC");
                      if (bVar1) {
                        MVar3 = NSC;
                      }
                      else {
                        bVar1 = std::operator==(__lhs,"Sun");
                        if (bVar1) {
                          MVar3 = Sun;
                        }
                        else {
                          bVar1 = std::operator==(__lhs,"IBM");
                          if (bVar1) {
                            MVar3 = IBM;
                          }
                          else {
                            bVar1 = std::operator==(__lhs,"Hewlett-Packard");
                            MVar3 = HP;
                            if (!bVar1) {
                              bVar1 = std::operator==(__lhs,"Motorola");
                              if (bVar1) {
                                MVar3 = Motorola;
                              }
                              else {
                                iVar2 = std::__cxx11::string::compare((ulong)family,0,(char *)0x7);
                                if (iVar2 != 0) {
                                  bVar1 = std::operator==(__lhs,"Apple");
                                  MVar3 = UnknownManufacturer - bVar1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this->ChipManufacturer = MVar3;
  return;
}

Assistant:

void SystemInformationImplementation::FindManufacturer(
  const std::string& family)
{
  if (this->ChipID.Vendor == "GenuineIntel")
    this->ChipManufacturer = Intel; // Intel Corp.
  else if (this->ChipID.Vendor == "UMC UMC UMC ")
    this->ChipManufacturer = UMC; // United Microelectronics Corp.
  else if (this->ChipID.Vendor == "AuthenticAMD")
    this->ChipManufacturer = AMD; // Advanced Micro Devices
  else if (this->ChipID.Vendor == "AMD ISBETTER")
    this->ChipManufacturer = AMD; // Advanced Micro Devices (1994)
  else if (this->ChipID.Vendor == "HygonGenuine")
    this->ChipManufacturer = Hygon; // Chengdu Haiguang IC Design Co., Ltd.
  else if (this->ChipID.Vendor == "CyrixInstead")
    this->ChipManufacturer = Cyrix; // Cyrix Corp., VIA Inc.
  else if (this->ChipID.Vendor == "NexGenDriven")
    this->ChipManufacturer = NexGen; // NexGen Inc. (now AMD)
  else if (this->ChipID.Vendor == "CentaurHauls")
    this->ChipManufacturer = IDT; // original IDT/Centaur/VIA (now Zhaoxin)
  else if (this->ChipID.Vendor == "  Shanghai  ")
    this->ChipManufacturer =
      Zhaoxin; // Shanghai Zhaoxin Semiconductor Co., Ltd.
  else if (this->ChipID.Vendor == "RiseRiseRise")
    this->ChipManufacturer = Rise; // Rise
  else if (this->ChipID.Vendor == "GenuineTMx86")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "TransmetaCPU")
    this->ChipManufacturer = Transmeta; // Transmeta
  else if (this->ChipID.Vendor == "Geode By NSC")
    this->ChipManufacturer = NSC; // National Semiconductor
  else if (this->ChipID.Vendor == "Sun")
    this->ChipManufacturer = Sun; // Sun Microelectronics
  else if (this->ChipID.Vendor == "IBM")
    this->ChipManufacturer = IBM; // IBM Microelectronics
  else if (this->ChipID.Vendor == "Hewlett-Packard")
    this->ChipManufacturer = HP; // Hewlett-Packard
  else if (this->ChipID.Vendor == "Motorola")
    this->ChipManufacturer = Motorola; // Motorola Microelectronics
  else if (family.compare(0, 7, "PA-RISC") == 0)
    this->ChipManufacturer = HP; // Hewlett-Packard
  else if (this->ChipID.Vendor == "Apple")
    this->ChipManufacturer = Apple; // Apple
  else
    this->ChipManufacturer = UnknownManufacturer; // Unknown manufacturer
}